

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall leveldb::Status::Status(Status *this,Code code,Slice *msg,Slice *msg2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  Slice *in_RCX;
  Slice *in_RDX;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  char *result;
  uint32_t size;
  uint32_t len2;
  uint32_t len1;
  int local_4c;
  
  sVar3 = Slice::size(in_RDX);
  iVar1 = (int)sVar3;
  sVar4 = Slice::size(in_RCX);
  iVar2 = (int)sVar4;
  if (iVar2 == 0) {
    local_4c = 0;
  }
  else {
    local_4c = iVar2 + 2;
  }
  piVar5 = (int *)operator_new__((ulong)(iVar1 + local_4c + 5));
  *piVar5 = iVar1 + local_4c;
  *(undefined1 *)(piVar5 + 1) = in_SIL;
  pcVar6 = Slice::data(in_RDX);
  memcpy((void *)((long)piVar5 + 5),pcVar6,sVar3 & 0xffffffff);
  if (iVar2 != 0) {
    *(undefined1 *)((long)piVar5 + (ulong)(iVar1 + 5)) = 0x3a;
    *(undefined1 *)((long)piVar5 + (ulong)(iVar1 + 6)) = 0x20;
    pcVar6 = Slice::data(in_RCX);
    memcpy((void *)((long)piVar5 + (sVar3 & 0xffffffff) + 7),pcVar6,sVar4 & 0xffffffff);
  }
  *in_RDI = piVar5;
  return;
}

Assistant:

Status::Status(Code code, const Slice& msg, const Slice& msg2) {
  assert(code != kOk);
  const uint32_t len1 = static_cast<uint32_t>(msg.size());
  const uint32_t len2 = static_cast<uint32_t>(msg2.size());
  const uint32_t size = len1 + (len2 ? (2 + len2) : 0);
  char* result = new char[size + 5];
  memcpy(result, &size, sizeof(size));
  result[4] = static_cast<char>(code);
  memcpy(result + 5, msg.data(), len1);
  if (len2) {
    result[5 + len1] = ':';
    result[6 + len1] = ' ';
    memcpy(result + 7 + len1, msg2.data(), len2);
  }
  state_ = result;
}